

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O1

void R_RebuildViewInterpolation(player_t *player)

{
  double dVar1;
  AActor *pAVar2;
  InterpolationViewer *pIVar3;
  
  if ((player != (player_t *)0x0) && (pAVar2 = (player->camera).field_0.p, pAVar2 != (AActor *)0x0))
  {
    if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (player->camera).field_0.p = (AActor *)0x0;
      return;
    }
    if (NoInterpolateView) {
      NoInterpolateView = false;
      pAVar2 = (player->camera).field_0.p;
      if ((pAVar2 != (AActor *)0x0) &&
         (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (player->camera).field_0.p = (AActor *)0x0;
        pAVar2 = (AActor *)0x0;
      }
      pIVar3 = FindPastViewer(pAVar2);
      (pIVar3->Old).Pos.Z = (pIVar3->New).Pos.Z;
      dVar1 = (pIVar3->New).Pos.Y;
      (pIVar3->Old).Pos.X = (pIVar3->New).Pos.X;
      (pIVar3->Old).Pos.Y = dVar1;
      (pIVar3->Old).Angles.Roll.Degrees = (pIVar3->New).Angles.Roll.Degrees;
      dVar1 = (pIVar3->New).Angles.Yaw.Degrees;
      (pIVar3->Old).Angles.Pitch.Degrees = (pIVar3->New).Angles.Pitch.Degrees;
      (pIVar3->Old).Angles.Yaw.Degrees = dVar1;
      if (InterpolationPath.Count != 0) {
        InterpolationPath.Count = 0;
      }
    }
  }
  return;
}

Assistant:

void R_RebuildViewInterpolation(player_t *player)
{
	if (player == NULL || player->camera == NULL)
		return;

	if (!NoInterpolateView)
		return;
	NoInterpolateView = false;

	InterpolationViewer *iview = FindPastViewer(player->camera);

	iview->Old = iview->New;
	InterpolationPath.Clear();
}